

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLAttribute * __thiscall tinyxml2::XMLElement::FindAttribute(XMLElement *this,char *name)

{
  XMLAttribute *pXVar1;
  int iVar2;
  char *__s1;
  
  pXVar1 = this->_rootAttribute;
  while (((pXVar1 != (XMLAttribute *)0x0 && (__s1 = StrPair::GetStr(&pXVar1->_name), __s1 != name))
         && (iVar2 = strncmp(__s1,name,0x7fffffff), iVar2 != 0))) {
    pXVar1 = pXVar1->_next;
  }
  return pXVar1;
}

Assistant:

const XMLAttribute* XMLElement::FindAttribute( const char* name ) const
{
    for( XMLAttribute* a = _rootAttribute; a; a = a->_next ) {
        if ( XMLUtil::StringEqual( a->Name(), name ) ) {
            return a;
        }
    }
    return 0;
}